

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.c
# Opt level: O0

int add_string_key_value_pair_to_map(AMQP_VALUE map,char *key,char *value)

{
  int iVar1;
  AMQP_VALUE key_00;
  LOGGER_LOG p_Var2;
  AMQP_VALUE value_00;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  AMQP_VALUE value_value;
  LOGGER_LOG l;
  AMQP_VALUE key_value;
  int result;
  char *value_local;
  char *key_local;
  AMQP_VALUE map_local;
  
  key_00 = amqpvalue_create_string(key);
  if (key_00 == (AMQP_VALUE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_management.c"
                ,"add_string_key_value_pair_to_map",0x297,1,"Could not create key value for %s",key)
      ;
    }
    key_value._4_4_ = 0x298;
  }
  else {
    value_00 = amqpvalue_create_string(value);
    if (value_00 == (AMQP_VALUE)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_management.c"
                  ,"add_string_key_value_pair_to_map",0x2a1,1,"Could not create value for key %s",
                  key);
      }
      key_value._4_4_ = 0x2a2;
    }
    else {
      iVar1 = amqpvalue_set_map_value(map,key_00,value_00);
      if (iVar1 == 0) {
        key_value._4_4_ = 0;
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_management.c"
                    ,"add_string_key_value_pair_to_map",0x2aa,1,
                    "Could not set the value in the map for key %s",key);
        }
        key_value._4_4_ = 0x2ab;
      }
      amqpvalue_destroy(value_00);
    }
    amqpvalue_destroy(key_00);
  }
  return key_value._4_4_;
}

Assistant:

static int add_string_key_value_pair_to_map(AMQP_VALUE map, const char* key, const char* value)
{
    int result;

    AMQP_VALUE key_value = amqpvalue_create_string(key);
    if (key_value == NULL)
    {
        /* Codes_SRS_CBS_01_072: [ If constructing the message fails, `cbs_put_token_async` shall fail and return a non-zero value. ]*/
        LogError("Failed creating value for property key %s", key);
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE value_value = amqpvalue_create_string(value);
        if (value_value == NULL)
        {
            /* Codes_SRS_CBS_01_072: [ If constructing the message fails, `cbs_put_token_async` shall fail and return a non-zero value. ]*/
            LogError("Failed creating value for property value %s", value);
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_map_value(map, key_value, value_value) != 0)
            {
                /* Codes_SRS_CBS_01_072: [ If constructing the message fails, `cbs_put_token_async` shall fail and return a non-zero value. ]*/
                LogError("Failed inserting key/value pair in the map");
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(value_value);
        }

        amqpvalue_destroy(key_value);
    }

    return result;
}